

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batch_matmul.c
# Opt level: O2

rt_function_error_t allocate_batch_matmul_local_context(rt_function_t *f)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  rt_variable_t **pprVar4;
  rt_variable_t *prVar5;
  int *piVar6;
  rt_variable_t *prVar7;
  rt_function_error_t rVar8;
  int *piVar9;
  rt_variable_getter p_Var10;
  rt_variable_setter p_Var11;
  code *pcVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  rt_list_t shape;
  
  rVar8 = RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  if ((f->num_of_inputs == 2) &&
     (rVar8 = RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS, f->num_of_outputs == 1)) {
    pvVar3 = f->local_context;
    piVar9 = (int *)(*rt_malloc_func)(0x68);
    if (piVar9 == (int *)0x0) {
      rVar8 = RT_FUNCTION_ERROR_MALLOC;
    }
    else {
      *(int **)f->local_context = piVar9;
      pprVar4 = f->inputs;
      prVar5 = *pprVar4;
      piVar6 = (prVar5->shape).data;
      lVar14 = (long)(prVar5->shape).size;
      iVar15 = piVar6[lVar14 + -2];
      piVar9[2] = iVar15;
      iVar16 = piVar6[lVar14 + -1];
      piVar9[1] = iVar16;
      prVar7 = pprVar4[1];
      piVar6 = (prVar7->shape).data;
      lVar14 = (long)(prVar7->shape).size;
      iVar1 = piVar6[lVar14 + -2];
      piVar9[4] = iVar1;
      iVar2 = piVar6[lVar14 + -1];
      piVar9[3] = iVar2;
      iVar13 = iVar16;
      if (*(char *)((long)pvVar3 + 8) == '\0') {
        iVar13 = iVar15;
      }
      piVar9[6] = iVar13;
      iVar18 = iVar1;
      if (*(char *)((long)pvVar3 + 9) == '\0') {
        iVar18 = iVar2;
      }
      piVar9[5] = iVar18;
      piVar9[7] = iVar16 * iVar15;
      piVar9[8] = iVar2 * iVar1;
      piVar9[9] = iVar18 * iVar13;
      *(rt_variable_t **)(piVar9 + 10) = prVar5;
      p_Var10 = select_getter(prVar5);
      *(rt_variable_getter *)(piVar9 + 0xc) = p_Var10;
      prVar5 = f->inputs[1];
      *(rt_variable_t **)(piVar9 + 0xe) = prVar5;
      p_Var10 = select_getter(prVar5);
      *(rt_variable_getter *)(piVar9 + 0x10) = p_Var10;
      *piVar9 = 1;
      pprVar4 = f->inputs;
      prVar5 = *pprVar4;
      iVar15 = (prVar5->shape).size;
      if (iVar15 < 3) {
        iVar15 = 2;
      }
      iVar16 = 1;
      for (uVar17 = 0; iVar15 - 2 != uVar17; uVar17 = uVar17 + 1) {
        iVar16 = iVar16 * (prVar5->shape).data[uVar17];
        *piVar9 = iVar16;
      }
      prVar5 = pprVar4[1];
      iVar15 = (prVar5->shape).size;
      iVar16 = 2;
      if (2 < iVar15) {
        iVar16 = iVar15;
      }
      iVar15 = 1;
      for (uVar17 = 0; iVar16 - 2 != uVar17; uVar17 = uVar17 + 1) {
        iVar15 = iVar15 * (prVar5->shape).data[uVar17];
      }
      prVar5 = *f->outputs;
      *(rt_variable_t **)(piVar9 + 0x12) = prVar5;
      p_Var10 = select_getter(prVar5);
      *(rt_variable_getter *)(piVar9 + 0x14) = p_Var10;
      p_Var11 = select_setter(*(rt_variable_t **)(piVar9 + 0x12));
      *(rt_variable_setter *)(piVar9 + 0x16) = p_Var11;
      shape._4_4_ = 0;
      shape.size = ((*f->outputs)->shape).size;
      shape.data = ((*f->outputs)->shape).data;
      iVar16 = calc_shape_size(shape);
      piVar9[0x18] = iVar16;
      rVar8 = RT_FUNCTION_ERROR_INVALID_SHAPE;
      if (*piVar9 == iVar15) {
        if ((((*(byte *)(*(long *)(piVar9 + 10) + 0x10) & 0xf) == 0) &&
            ((*(byte *)(*(long *)(piVar9 + 0xe) + 0x10) & 0xf) == 0)) &&
           ((*(byte *)(*(long *)(piVar9 + 0x12) + 0x10) & 0xf) == 0)) {
          pcVar12 = exec_batch_matmul;
        }
        else {
          pcVar12 = exec_batch_matmul_generic;
        }
        f->exec_func = pcVar12;
        rVar8 = RT_FUNCTION_ERROR_NOERROR;
      }
    }
  }
  return rVar8;
}

Assistant:

rt_function_error_t allocate_batch_matmul_local_context(rt_function_t *f) {
  if (f->num_of_inputs != 2) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  }
  if (f->num_of_outputs != 1) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS;
  }

  batch_matmul_local_context_t *context =
      (batch_matmul_local_context_t *)(f->local_context);
  batch_matmul_private_t *p = rt_malloc_func(sizeof(batch_matmul_private_t));
  if (p == 0) {
    return RT_FUNCTION_ERROR_MALLOC;
  }
  ((batch_matmul_local_context_t *)(f->local_context))->data = (void *)p;
  p->row_a = f->inputs[0]->shape.data[f->inputs[0]->shape.size - 2];
  p->col_a = f->inputs[0]->shape.data[f->inputs[0]->shape.size - 1];
  p->row_b = f->inputs[1]->shape.data[f->inputs[1]->shape.size - 2];
  p->col_b = f->inputs[1]->shape.data[f->inputs[1]->shape.size - 1];
  p->row_y = context->transpose_a ? p->col_a : p->row_a;
  p->col_y = context->transpose_b ? p->row_b : p->col_b;
  p->offset_a = p->row_a * p->col_a;
  p->offset_b = p->row_b * p->col_b;
  p->offset_y = p->row_y * p->col_y;

  p->input_a = f->inputs[0];
  p->get_input_a = select_getter(p->input_a);
  p->input_b = f->inputs[1];
  p->get_input_b = select_getter(p->input_b);

  p->samples = 1;
  for (int i = 0; i < f->inputs[0]->shape.size - 2; ++i) {
    p->samples *= f->inputs[0]->shape.data[i];
  }

  int samples_b = 1;
  for (int j = 0; j < f->inputs[1]->shape.size - 2; ++j) {
    samples_b *= f->inputs[1]->shape.data[j];
  }

  p->output = f->outputs[0];
  p->get_output = select_getter(p->output);
  p->set_output = select_setter(p->output);
  p->output_size = calc_shape_size(f->outputs[0]->shape);

  if (p->samples != samples_b) {
    return RT_FUNCTION_ERROR_INVALID_SHAPE;
  }
  if (p->input_a->type == NN_DATA_TYPE_FLOAT &&
      p->input_b->type == NN_DATA_TYPE_FLOAT &&
      p->output->type == NN_DATA_TYPE_FLOAT) {
#ifdef CONFIG_BATCHMATMUL_FLOAT32
    f->exec_func = exec_batch_matmul;
#endif /* CONFIG_BATCHMATMUL_FLOAT32 */
  } else {
#ifdef CONFIG_BATCHMATMUL_GENERIC
    f->exec_func = exec_batch_matmul_generic;
#endif /* CONFIG_BATCHMATMUL_GENERIC */
  }
  return RT_FUNCTION_ERROR_NOERROR;
}